

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

CropResizeLayerParams * __thiscall
CoreML::Specification::CropResizeLayerParams::New(CropResizeLayerParams *this,Arena *arena)

{
  CropResizeLayerParams *this_00;
  
  this_00 = (CropResizeLayerParams *)operator_new(0x48);
  CropResizeLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::CropResizeLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

CropResizeLayerParams* CropResizeLayerParams::New(::google::protobuf::Arena* arena) const {
  CropResizeLayerParams* n = new CropResizeLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}